

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::protos::gen::TracingServiceState_TracingSession::TracingServiceState_TracingSession
          (TracingServiceState_TracingSession *this)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__TracingServiceState_TracingSession_003c7200;
  this->id_ = 0;
  this->consumer_uid_ = 0;
  (this->state_)._M_dataplus._M_p = (pointer)&(this->state_).field_2;
  (this->state_)._M_string_length = 0;
  (this->state_).field_2._M_local_buf[0] = '\0';
  (this->unique_session_name_)._M_dataplus._M_p = (pointer)&(this->unique_session_name_).field_2;
  (this->unique_session_name_)._M_string_length = 0;
  (this->unique_session_name_).field_2._M_local_buf[0] = '\0';
  (this->buffer_size_kb_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffer_size_kb_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buffer_size_kb_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->duration_ms_ = 0;
  this->num_data_sources_ = 0;
  this->start_realtime_ns_ = 0;
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)&(this->unknown_fields_).field_2;
  (this->unknown_fields_)._M_string_length = 0;
  (this->unknown_fields_).field_2._M_local_buf[0] = '\0';
  (this->_has_field_).super__Base_bitset<1UL>._M_w = 0;
  return;
}

Assistant:

TracingServiceState_TracingSession::TracingServiceState_TracingSession() = default;